

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Debug * Corrade::Utility::operator<<(Debug *debug,Color value)

{
  Debug *pDVar1;
  Color value_local;
  Debug *debug_local;
  
  switch(value) {
  case Black:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::Black");
    break;
  case Red:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::Red");
    break;
  case Green:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::Green");
    break;
  case Yellow:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::Yellow");
    break;
  case Blue:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::Blue");
    break;
  case Magenta:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::Magenta");
    break;
  case Cyan:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::Cyan");
    break;
  case White:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::White");
    break;
  default:
    pDVar1 = Debug::operator<<(debug,"Utility::Debug::Color(");
    pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
    pDVar1 = Debug::operator<<(pDVar1,Debug::hex);
    pDVar1 = Debug::operator<<(pDVar1,value);
    pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
    debug_local = Debug::operator<<(pDVar1,")");
    break;
  case Default:
    debug_local = Debug::operator<<(debug,"Utility::Debug::Color::Default");
  }
  return debug_local;
}

Assistant:

Debug& operator<<(Debug& debug, Debug::Color value) {
    switch(value) {
        /* LCOV_EXCL_START */
        #define _c(value) case Debug::Color::value: return debug << "Utility::Debug::Color::" #value;
        _c(Black)
        _c(Red)
        _c(Green)
        _c(Yellow)
        _c(Blue)
        _c(Magenta)
        _c(Cyan)
        _c(White)
        #if !defined(CORRADE_TARGET_WINDOWS) || defined(CORRADE_UTILITY_USE_ANSI_COLORS)
        _c(Default) /* Alias to White on Windows */
        #endif
        #undef _c
        /* LCOV_EXCL_STOP */
    }

    return debug << "Utility::Debug::Color(" << Debug::nospace << Debug::hex << static_cast<unsigned char>(char(value)) << Debug::nospace << ")";
}